

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

triplet<unsigned_char> __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
::decode_run_interruption_pixel
          (jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::decoder_strategy>
           *this,triplet<unsigned_char> ra,triplet<unsigned_char> rb)

{
  default_traits<unsigned_char,_charls::triplet<unsigned_char>_> *this_00;
  array<charls::context_run_mode,_2UL> *context;
  int iVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  uint uVar8;
  
  context = &this->context_run_mode_;
  iVar5 = decode_run_interruption_error(this,context->_M_elems);
  iVar6 = decode_run_interruption_error(this,context->_M_elems);
  iVar7 = decode_run_interruption_error(this,context->_M_elems);
  this_00 = &this->traits_;
  iVar1 = -iVar5;
  if (((uint3)ra & 0xff) <= ((uint3)rb & 0xff)) {
    iVar1 = iVar5;
  }
  bVar2 = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * iVar1 + ((uint3)rb & 0xff));
  uVar8 = rb._1_2_ & 0xff;
  iVar1 = -iVar6;
  if ((ra._1_2_ & 0xff) <= uVar8) {
    iVar1 = iVar6;
  }
  bVar3 = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * iVar1 + uVar8);
  iVar1 = -iVar7;
  if ((uint)((uint3)ra >> 0x10) <= (uint)rb.field_2.v3) {
    iVar1 = iVar7;
  }
  bVar4 = default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::fix_reconstructed_value
                    (this_00,((this->traits_).near_lossless * 2 + 1) * iVar1 + (uint)rb.field_2.v3);
  return (triplet<unsigned_char>)((uint3)bVar2 | (uint3)bVar3 << 8 | (uint3)bVar4 << 0x10);
}

Assistant:

triplet<sample_type> decode_run_interruption_pixel(triplet<sample_type> ra, triplet<sample_type> rb)
    {
        const int32_t error_value1{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value2{decode_run_interruption_error(context_run_mode_[0])};
        const int32_t error_value3{decode_run_interruption_error(context_run_mode_[0])};

        return triplet<sample_type>(traits_.compute_reconstructed_sample(rb.v1, error_value1 * sign(rb.v1 - ra.v1)),
                                    traits_.compute_reconstructed_sample(rb.v2, error_value2 * sign(rb.v2 - ra.v2)),
                                    traits_.compute_reconstructed_sample(rb.v3, error_value3 * sign(rb.v3 - ra.v3)));
    }